

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_double,_const_int>
* __thiscall
fmt::v7::
make_args_checked<double_const&,int_const&,std::basic_string_view<char,std::char_traits<char>>,char>
          (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_double,_const_int>
           *__return_storage_ptr__,v7 *this,
          basic_string_view<char,_std::char_traits<char>_> *format_str,
          remove_reference_t<const_double_&> *args,remove_reference_t<const_int_&> *args_1)

{
  remove_reference_t<const_int_&> *args_local_1;
  remove_reference_t<const_double_&> *args_local;
  basic_string_view<char,_std::char_traits<char>_> *format_str_local;
  
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_double,_const_int>
  ::format_arg_store(__return_storage_ptr__,(double *)format_str,(int *)args);
  return __return_storage_ptr__;
}

Assistant:

inline auto make_args_checked(const S& format_str,
                              const remove_reference_t<Args>&... args)
    -> format_arg_store<buffer_context<Char>, remove_reference_t<Args>...> {
  static_assert(
      detail::count<(
              std::is_base_of<detail::view, remove_reference_t<Args>>::value &&
              std::is_reference<Args>::value)...>() == 0,
      "passing views as lvalues is disallowed");
  detail::check_format_string<Args...>(format_str);
  return {args...};
}